

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

void mbedtls_md_free(mbedtls_md_context_t *ctx)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  if ((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) {
    if (ctx->md_ctx != (void *)0x0) {
      (*ctx->md_info->ctx_free_func)(ctx->md_ctx);
    }
    pvVar2 = ctx->hmac_ctx;
    if (pvVar2 != (void *)0x0) {
      iVar1 = ctx->md_info->block_size;
      if (iVar1 != 0) {
        lVar3 = 0;
        do {
          *(undefined1 *)((long)pvVar2 + lVar3) = 0;
          lVar3 = lVar3 + 1;
        } while (iVar1 * 2 != lVar3);
      }
      free(ctx->hmac_ctx);
    }
    lVar3 = 0;
    do {
      *(undefined1 *)((long)&ctx->md_info + lVar3) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x18);
  }
  return;
}

Assistant:

void mbedtls_md_free( mbedtls_md_context_t *ctx )
{
    if( ctx == NULL || ctx->md_info == NULL )
        return;

    if( ctx->md_ctx != NULL )
        ctx->md_info->ctx_free_func( ctx->md_ctx );

    if( ctx->hmac_ctx != NULL )
    {
        mbedtls_zeroize( ctx->hmac_ctx, 2 * ctx->md_info->block_size );
        mbedtls_free( ctx->hmac_ctx );
    }

    mbedtls_zeroize( ctx, sizeof( mbedtls_md_context_t ) );
}